

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintexteditsearchwidget.cpp
# Opt level: O1

bool __thiscall
QPlainTextEditSearchWidget::doSearch
          (QPlainTextEditSearchWidget *this,bool searchDown,bool allowRestartAtTop,bool updateUI)

{
  undefined8 uVar1;
  QString *pQVar2;
  char cVar3;
  QArrayData *pQVar4;
  char cVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  int extraout_var;
  QMargins *pQVar11;
  char16_t *pcVar12;
  MoveMode MVar13;
  QByteArrayView QVar14;
  QString t_1;
  QString t_2;
  QString t_3;
  QString text;
  QString t;
  QMargins margins;
  QRegularExpression local_110;
  QRegularExpression local_108;
  QArrayData *local_100;
  char16_t *local_f8;
  undefined8 uStack_f0;
  QString local_e8;
  QString local_d0;
  QString local_b8;
  QArrayData *local_a0 [2];
  long local_90;
  QArrayData *local_88;
  char16_t *local_80;
  undefined8 local_78;
  QArrayData *local_70;
  char16_t *local_68;
  undefined8 local_60;
  QString local_58;
  undefined1 local_40 [16];
  
  cVar5 = QTimer::isActive();
  if (cVar5 != '\0') {
    stopDebounce(this);
  }
  QLineEdit::text();
  if (local_90 == 0) {
    if (updateUI) {
      pQVar2 = *(QString **)(*(long *)(this + 0x28) + 8);
      QVar14.m_data = (storage_type *)0x0;
      QVar14.m_size = (qsizetype)&local_100;
      QString::fromLatin1(QVar14);
      pQVar4 = local_100;
      uStack_f0 = 0;
      local_f8 = (char16_t *)0x0;
      local_100 = (QArrayData *)0x0;
      QWidget::setStyleSheet(pQVar2);
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar4,2,8);
        }
      }
    }
    bVar7 = 0;
    goto LAB_0011a7ff;
  }
  iVar8 = QComboBox::currentIndex();
  bVar6 = QAbstractButton::isChecked();
  cVar5 = !searchDown + '\x04';
  if (iVar8 != 1) {
    cVar5 = !searchDown;
  }
  cVar3 = cVar5 + '\x02';
  if (bVar6 == 0) {
    cVar3 = cVar5;
  }
  QObject::blockSignals(SUB81(*(undefined8 *)(this + 0x88),0));
  uVar1 = *(undefined8 *)(this + 0x88);
  if (iVar8 == 2) {
    QRegularExpression::QRegularExpression(&local_108,local_a0,bVar6 ^ 1);
    bVar7 = QPlainTextEdit::find(uVar1,&local_108,cVar3);
    QRegularExpression::~QRegularExpression(&local_108);
  }
  else {
    bVar7 = QPlainTextEdit::find(uVar1,local_a0,cVar3);
  }
  QObject::blockSignals(SUB81(*(undefined8 *)(this + 0x88),0));
  if (bVar7 == 0) {
    if (allowRestartAtTop) goto LAB_0011a3f3;
  }
  else {
    iVar9 = (searchDown - 1 | 1) + *(int *)(this + 0x34);
    if (*(int *)(this + 0x30) < iVar9) {
      iVar9 = *(int *)(this + 0x30);
    }
    *(int *)(this + 0x34) = iVar9;
    updateSearchCountLabelText(this);
    if (allowRestartAtTop && bVar7 == 0) {
LAB_0011a3f3:
      MVar13 = 0xb;
      if (searchDown) {
        MVar13 = KeepAnchor;
      }
      QPlainTextEdit::moveCursor((MoveOperation)*(undefined8 *)(this + 0x88),MVar13);
      uVar1 = *(undefined8 *)(this + 0x88);
      if (iVar8 == 2) {
        QRegularExpression::QRegularExpression(&local_110,local_a0,bVar6 ^ 1);
        bVar7 = QPlainTextEdit::find(uVar1,&local_110,cVar3);
        QRegularExpression::~QRegularExpression(&local_110);
      }
      else {
        bVar7 = QPlainTextEdit::find(uVar1,local_a0,cVar3);
      }
      if ((bVar7 & updateUI) == 1) {
        uVar10 = 1;
        if (!searchDown) {
          uVar10 = *(undefined4 *)(this + 0x30);
        }
        *(undefined4 *)(this + 0x34) = uVar10;
        updateSearchCountLabelText(this);
      }
    }
  }
  if (updateUI) {
    QPlainTextEdit::cursorRect();
    QWidget::layout();
    local_40 = QLayout::contentsMargins();
    iVar9 = *(int *)(*(long *)(this + 0x20) + 0x20) - *(int *)(*(long *)(this + 0x20) + 0x18);
    iVar8 = 0;
    if (*(int *)(*(long *)(*(long *)(this + 0x88) + 0x20) + 0x20) -
        (*(int *)(*(long *)(*(long *)(this + 0x88) + 0x20) + 0x18) + iVar9) < extraout_var) {
      iVar8 = iVar9 + 0xb;
    }
    if (local_40._12_4_ != iVar8) {
      local_40._12_4_ = iVar8;
      pQVar11 = (QMargins *)QWidget::layout();
      QLayout::setContentsMargins(pQVar11);
    }
    pcVar12 = L"#8d2b36";
    if (bVar7 != 0) {
      pcVar12 = L"#135a13";
    }
    local_f8 = L"#FAE9EB";
    if (bVar7 != 0) {
      local_f8 = L"#D5FAE2";
    }
    if (this[0x90] != (QPlainTextEditSearchWidget)0x0) {
      local_f8 = pcVar12;
    }
    local_100 = (QArrayData *)0x0;
    uStack_f0 = 7;
    pQVar2 = *(QString **)(*(long *)(this + 0x28) + 8);
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = L"* { background: ";
    local_58.d.size = 0x10;
    QString::append(&local_58);
    local_70 = (QArrayData *)0x0;
    local_68 = L"; color: ";
    local_60 = 9;
    local_e8.d.d = local_58.d.d;
    local_e8.d.ptr = local_58.d.ptr;
    local_e8.d.size = local_58.d.size;
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::append(&local_e8);
    local_d0.d.d = local_e8.d.d;
    local_d0.d.ptr = local_e8.d.ptr;
    local_d0.d.size = local_e8.d.size;
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::append(&local_d0);
    local_88 = (QArrayData *)0x0;
    local_80 = L"; }";
    local_78 = 3;
    local_b8.d.d = local_d0.d.d;
    local_b8.d.ptr = local_d0.d.ptr;
    local_b8.d.size = local_d0.d.size;
    if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::append(&local_b8);
    QWidget::setStyleSheet(pQVar2);
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_88 != (QArrayData *)0x0) {
      LOCK();
      (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_88,2,8);
      }
    }
    if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d0.d.d)->super_QArrayData,2,8);
      }
    }
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_70 != (QArrayData *)0x0) {
      LOCK();
      (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_70,2,8);
      }
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
      }
    }
    QPlainTextEdit::setExtraSelections(*(QList **)(this + 0x88));
    if (local_100 != (QArrayData *)0x0) {
      LOCK();
      (local_100->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_100->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_100->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_100,2,8);
      }
    }
  }
LAB_0011a7ff:
  if (local_a0[0] != (QArrayData *)0x0) {
    LOCK();
    (local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_a0[0],2,8);
    }
  }
  return (bool)bVar7;
}

Assistant:

bool QPlainTextEditSearchWidget::doSearch(bool searchDown,
                                          bool allowRestartAtTop,
                                          bool updateUI) {
    if (_debounceTimer.isActive()) {
        stopDebounce();
    }

    const QString text = ui->searchLineEdit->text();

    if (text.isEmpty()) {
        if (updateUI) {
            ui->searchLineEdit->setStyleSheet(QLatin1String(""));
        }

        return false;
    }

    const int searchMode = ui->modeComboBox->currentIndex();
    const bool caseSensitive = ui->matchCaseSensitiveButton->isChecked();

    QFlags<QTextDocument::FindFlag> options =
        searchDown ? QTextDocument::FindFlag(0) : QTextDocument::FindBackward;
    if (searchMode == WholeWordsMode) {
        options |= QTextDocument::FindWholeWords;
    }

    if (caseSensitive) {
        options |= QTextDocument::FindCaseSensitively;
    }

    // block signal to reduce too many signals being fired and too many updates
    _textEdit->blockSignals(true);

    bool found =
        searchMode == RegularExpressionMode
            ?
#if (QT_VERSION >= QT_VERSION_CHECK(5, 13, 0))
            _textEdit->find(
                QRegularExpression(
                    text, caseSensitive
                              ? QRegularExpression::NoPatternOption
                              : QRegularExpression::CaseInsensitiveOption),
                options)
            :
#else
            _textEdit->find(QRegExp(text, caseSensitive ? Qt::CaseSensitive
                                                        : Qt::CaseInsensitive),
                            options)
            :
#endif
            _textEdit->find(text, options);

    _textEdit->blockSignals(false);

    if (found) {
        const int result =
            searchDown ? ++_currentSearchResult : --_currentSearchResult;
        _currentSearchResult = std::min(result, _searchResultCount);

        updateSearchCountLabelText();
    }

    // start at the top (or bottom) if not found
    if (!found && allowRestartAtTop) {
        _textEdit->moveCursor(searchDown ? QTextCursor::Start
                                         : QTextCursor::End);
        found =
            searchMode == RegularExpressionMode
                ?
#if (QT_VERSION >= QT_VERSION_CHECK(5, 13, 0))
                _textEdit->find(
                    QRegularExpression(
                        text, caseSensitive
                                  ? QRegularExpression::NoPatternOption
                                  : QRegularExpression::CaseInsensitiveOption),
                    options)
                :
#else
                _textEdit->find(
                    QRegExp(text, caseSensitive ? Qt::CaseSensitive
                                                : Qt::CaseInsensitive),
                    options)
                :
#endif
                _textEdit->find(text, options);

        if (found && updateUI) {
            _currentSearchResult = searchDown ? 1 : _searchResultCount;
            updateSearchCountLabelText();
        }
    }

    if (updateUI) {
        const QRect rect = _textEdit->cursorRect();
        QMargins margins = _textEdit->layout()->contentsMargins();
        const int searchWidgetHotArea = _textEdit->height() - this->height();
        const int marginBottom =
            (rect.y() > searchWidgetHotArea) ? (this->height() + 10) : 0;

        // move the search box a bit up if we would block the search result
        if (margins.bottom() != marginBottom) {
            margins.setBottom(marginBottom);
            _textEdit->layout()->setContentsMargins(margins);
        }

        // add a background color according if we found the text or not
        const QString bgColorCode =
            _darkMode
                ? (found ? QStringLiteral("#135a13")
                         : QStringLiteral("#8d2b36"))
                : found ? QStringLiteral("#D5FAE2") : QStringLiteral("#FAE9EB");
        const QString fgColorCode =
            _darkMode ? QStringLiteral("#cccccc") : QStringLiteral("#404040");

        ui->searchLineEdit->setStyleSheet(
            QStringLiteral("* { background: ") + bgColorCode +
            QStringLiteral("; color: ") + fgColorCode + QStringLiteral("; }"));

        // restore the search extra selections after the find command
        this->setSearchExtraSelections();
    }

    return found;
}